

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Option::_validate_results(Option *this,results_t *res)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  ValidationError *pVVar5;
  int local_15c;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string err_msg_1;
  string *result_1;
  iterator __end3_1;
  iterator __begin3_1;
  results_t *__range3_1;
  int index_1;
  string local_80;
  undefined1 local_60 [8];
  string err_msg;
  string *result;
  iterator __end3;
  iterator __begin3;
  results_t *__range3;
  int index;
  results_t *res_local;
  Option *this_local;
  
  bVar1 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::empty(&this->validators_);
  if (!bVar1) {
    if (this->type_size_max_ < 2) {
      __range3_1._0_4_ = 0;
      iVar2 = this->expected_max_;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(res);
      if ((iVar2 < (int)sVar3) &&
         (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == TakeLast ||
          ((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Reverse)))) {
        iVar2 = this->expected_max_;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(res);
        __range3_1._0_4_ = iVar2 - (int)sVar3;
      }
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(res);
      result_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(res);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&result_1), bVar1) {
        err_msg_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3_1);
        _validate((string *)local_f8,this,(string *)err_msg_1.field_2._8_8_,(int)__range3_1);
        __range3_1._0_4_ = (int)__range3_1 + 1;
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pVVar5 = (ValidationError *)__cxa_allocate_exception(0x38);
          get_name_abi_cxx11_(&local_118,this,false,false);
          ::std::__cxx11::string::string((string *)&local_138,(string *)local_f8);
          ValidationError::ValidationError(pVVar5,&local_118,&local_138);
          __cxa_throw(pVVar5,&ValidationError::typeinfo,ValidationError::~ValidationError);
        }
        ::std::__cxx11::string::~string((string *)local_f8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
    }
    else {
      __range3._4_4_ = 0;
      iVar2 = get_items_expected_max(this);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(res);
      if ((iVar2 < (int)sVar3) &&
         (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == TakeLast ||
          ((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Reverse)))) {
        iVar2 = get_items_expected_max(this);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(res);
        __range3._4_4_ = iVar2 - (int)sVar3;
      }
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(res);
      result = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(res);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&result), bVar1) {
        err_msg.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
        bVar1 = detail::is_separator((string *)err_msg.field_2._8_8_);
        if (((bVar1) && (this->type_size_max_ != this->type_size_min_)) && (-1 < __range3._4_4_)) {
          __range3._4_4_ = 0;
        }
        else {
          if (__range3._4_4_ < 0) {
            local_15c = __range3._4_4_;
          }
          else {
            local_15c = __range3._4_4_ % this->type_size_max_;
          }
          _validate((string *)local_60,this,(string *)err_msg.field_2._8_8_,local_15c);
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            pVVar5 = (ValidationError *)__cxa_allocate_exception(0x38);
            get_name_abi_cxx11_(&local_80,this,false,false);
            ::std::__cxx11::string::string((string *)&index_1,(string *)local_60);
            ValidationError::ValidationError(pVVar5,&local_80,(string *)&index_1);
            __cxa_throw(pVVar5,&ValidationError::typeinfo,ValidationError::~ValidationError);
          }
          __range3._4_4_ = __range3._4_4_ + 1;
          ::std::__cxx11::string::~string((string *)local_60);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  return;
}

Assistant:

CLI11_INLINE void Option::_validate_results(results_t &res) const {
    // Run the Validators (can change the string)
    if(!validators_.empty()) {
        if(type_size_max_ > 1) {  // in this context index refers to the index in the type
            int index = 0;
            if(get_items_expected_max() < static_cast<int>(res.size()) &&
               (multi_option_policy_ == CLI::MultiOptionPolicy::TakeLast ||
                multi_option_policy_ == CLI::MultiOptionPolicy::Reverse)) {
                // create a negative index for the earliest ones
                index = get_items_expected_max() - static_cast<int>(res.size());
            }

            for(std::string &result : res) {
                if(detail::is_separator(result) && type_size_max_ != type_size_min_ && index >= 0) {
                    index = 0;  // reset index for variable size chunks
                    continue;
                }
                auto err_msg = _validate(result, (index >= 0) ? (index % type_size_max_) : index);
                if(!err_msg.empty())
                    throw ValidationError(get_name(), err_msg);
                ++index;
            }
        } else {
            int index = 0;
            if(expected_max_ < static_cast<int>(res.size()) &&
               (multi_option_policy_ == CLI::MultiOptionPolicy::TakeLast ||
                multi_option_policy_ == CLI::MultiOptionPolicy::Reverse)) {
                // create a negative index for the earliest ones
                index = expected_max_ - static_cast<int>(res.size());
            }
            for(std::string &result : res) {
                auto err_msg = _validate(result, index);
                ++index;
                if(!err_msg.empty())
                    throw ValidationError(get_name(), err_msg);
            }
        }
    }
}